

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

bool __thiscall QTimeZone::hasTransitions(QTimeZone *this)

{
  QTimeZonePrivate *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QTimeZone QStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d;
  if (((ulong)this_00 & 3) == 0) {
    if (this_00 != (QTimeZonePrivate *)0x0) {
      bVar1 = QTimeZonePrivate::isValid(this_00);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          iVar2 = (*((this->d).d)->_vptr_QTimeZonePrivate[0x10])();
          return SUB41(iVar2,0);
        }
        goto LAB_00350dab;
      }
    }
LAB_00350d6a:
    bVar1 = false;
  }
  else {
    if (((int)this_00 - 1U & 3) != 0) goto LAB_00350d6a;
    systemTimeZone();
    bVar1 = hasTransitions(&QStack_18);
    ~QTimeZone(&QStack_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
LAB_00350dab:
  __stack_chk_fail();
}

Assistant:

bool QTimeZone::hasTransitions() const
{
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().hasTransitions();
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            return false;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (isValid()) {
        return d->hasTransitions();
    }
    return false;
}